

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_l2_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *src0;
  ggml_tensor *in_stack_000000b8;
  ggml_compute_params *in_stack_000000c0;
  
  if (**(int **)(in_RSI + 0x98) == 0) {
    ggml_compute_forward_l2_norm_f32(in_stack_000000c0,in_stack_000000b8);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdf6,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_l2_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_l2_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}